

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

void pubkey_show(Curl_easy *data,BIO *mem,int num,char *type,char *name,BIGNUM *bn)

{
  size_t valuelen;
  long info_len;
  char namebuf [32];
  char *local_40;
  char *ptr;
  BIGNUM *bn_local;
  char *name_local;
  char *type_local;
  BIO *pBStack_18;
  int num_local;
  BIO *mem_local;
  Curl_easy *data_local;
  
  ptr = (char *)bn;
  bn_local = (BIGNUM *)name;
  name_local = type;
  type_local._4_4_ = num;
  pBStack_18 = (BIO *)mem;
  mem_local = (BIO *)data;
  curl_msnprintf((char *)&info_len,0x20,"%s(%s)",type,name);
  if (ptr != (char *)0x0) {
    BN_print(pBStack_18,(BIGNUM *)ptr);
  }
  valuelen = BIO_ctrl(pBStack_18,3,0,&local_40);
  Curl_ssl_push_certinfo_len
            ((Curl_easy *)mem_local,type_local._4_4_,(char *)&info_len,local_40,valuelen);
  BIO_ctrl(pBStack_18,1,0,(void *)0x0);
  return;
}

Assistant:

static void pubkey_show(struct Curl_easy *data,
                        BIO *mem,
                        int num,
                        const char *type,
                        const char *name,
#ifdef HAVE_OPAQUE_RSA_DSA_DH
                        const
#endif
                        BIGNUM *bn)
{
  char *ptr;
  char namebuf[32];

  snprintf(namebuf, sizeof(namebuf), "%s(%s)", type, name);

  if(bn)
    BN_print(mem, bn);
  push_certinfo(namebuf, num);
}